

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O3

void Fra_ImpRecordInManager(Fra_Man_t *p,Aig_Man_t *pNew)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  void *pvVar5;
  void *pvVar6;
  uint uVar7;
  Vec_Int_t *pVVar8;
  Aig_Obj_t *pDriver;
  uint uVar9;
  int iVar10;
  long lVar11;
  
  pVVar8 = p->pCla->vImps;
  if ((pVVar8 != (Vec_Int_t *)0x0) && (pVVar8->nSize != 0)) {
    iVar1 = pNew->nObjs[3];
    iVar10 = iVar1;
    if (0 < pVVar8->nSize) {
      lVar11 = 0;
      do {
        uVar9 = pVVar8->pArray[lVar11] & 0xffff;
        pVVar3 = p->pManAig->vObjs;
        uVar2 = pVVar3->nSize;
        if ((((int)uVar2 <= (int)uVar9) || (uVar7 = pVVar8->pArray[lVar11] >> 0x10, (int)uVar7 < 0))
           || (uVar2 <= uVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        ppvVar4 = pVVar3->pArray;
        pvVar5 = ppvVar4[uVar9];
        pvVar6 = ppvVar4[uVar7];
        pDriver = Aig_Or(pNew,(Aig_Obj_t *)
                              ((ulong)(*(uint *)((long)pvVar5 + 0x18) >> 3 & 1) ^
                               *(ulong *)((long)pvVar5 + 0x28) ^ 1),
                         (Aig_Obj_t *)
                         ((ulong)(*(uint *)((long)pvVar6 + 0x18) >> 3 & 1) ^
                         *(ulong *)((long)pvVar6 + 0x28)));
        Aig_ObjCreateCo(pNew,pDriver);
        lVar11 = lVar11 + 1;
        pVVar8 = p->pCla->vImps;
      } while (lVar11 < pVVar8->nSize);
      iVar10 = pNew->nObjs[3];
    }
    pNew->nAsserts = iVar10 - iVar1;
  }
  return;
}

Assistant:

void Fra_ImpRecordInManager( Fra_Man_t * p, Aig_Man_t * pNew )
{
    Aig_Obj_t * pLeft, * pRight, * pMiter;
    int nPosOld, Imp, i;
    if ( p->pCla->vImps == NULL || Vec_IntSize(p->pCla->vImps) == 0 )
        return;
    // go through the implication
    nPosOld = Aig_ManCoNum(pNew);
    Vec_IntForEachEntry( p->pCla->vImps, Imp, i )
    {
        pLeft = Aig_ManObj( p->pManAig, Fra_ImpLeft(Imp) );
        pRight = Aig_ManObj( p->pManAig, Fra_ImpRight(Imp) );
        // record the implication: L' + R
        pMiter = Aig_Or( pNew, 
            Aig_NotCond((Aig_Obj_t *)pLeft->pData, !pLeft->fPhase), 
            Aig_NotCond((Aig_Obj_t *)pRight->pData, pRight->fPhase) ); 
        Aig_ObjCreateCo( pNew, pMiter );
    }
    pNew->nAsserts = Aig_ManCoNum(pNew) - nPosOld;
}